

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

void __thiscall
wallet::anon_unknown_5::WalletImpl::commitTransaction
          (WalletImpl *this,CTransactionRef tx,WalletValueMap value_map,WalletOrderForm order_form)

{
  CWallet *this_00;
  pointer pCVar1;
  _Base_ptr p_Var2;
  mapValue_t mapValue;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  orderForm;
  undefined1 auVar3 [24];
  _Atomic_word *p_Var4;
  undefined1 (*in_RCX) [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  element_type *peVar6;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  undefined8 in_stack_ffffffffffffff80;
  pointer this_01;
  pointer pCVar7;
  bool bVar8;
  undefined1 in_stack_ffffffffffffffa1 [15];
  _Rb_tree_color local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr p_Stack_38;
  size_t local_30;
  long local_28;
  
  _Var5 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  peVar6 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar7 = (pointer)&((this->m_wallet).
                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     cs_wallet;
  bVar8 = false;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff98);
  this_00 = (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar1 = (peVar6->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_01 = (peVar6->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (peVar6->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (peVar6->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_40 = (_Base_ptr)&stack0xffffffffffffffb0;
  local_48 = (_Base_ptr)_Var5._M_pi[1]._vptr__Sp_counted_base;
  if (local_48 == (_Base_ptr)0x0) {
    p_Var4 = (_Atomic_word *)&local_30;
    local_50 = _S_red;
    local_48 = (_Base_ptr)0x0;
    p_Stack_38 = local_40;
  }
  else {
    local_50 = (_Var5._M_pi)->_M_use_count;
    p_Var2 = *(_Base_ptr *)&_Var5._M_pi[1]._M_use_count;
    p_Stack_38 = (_Base_ptr)_Var5._M_pi[2]._vptr__Sp_counted_base;
    local_48->_M_parent = local_40;
    p_Var4 = &_Var5._M_pi[2]._M_use_count;
    local_30._0_4_ = _Var5._M_pi[2]._M_use_count;
    local_30._4_4_ = _Var5._M_pi[2]._M_weak_count;
    _Var5._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Atomic_word **)&_Var5._M_pi[1]._M_use_count = &(_Var5._M_pi)->_M_use_count;
    _Var5._M_pi[2]._vptr__Sp_counted_base = (_func_int **)&(_Var5._M_pi)->_M_use_count;
    local_40 = p_Var2;
  }
  *(size_t *)p_Var4 = 0;
  auVar3 = *in_RCX;
  *(undefined8 *)(*in_RCX + 0x10) = 0;
  *(undefined8 *)*in_RCX = 0;
  *(undefined8 *)(*in_RCX + 8) = 0;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_ffffffffffffff80;
  mapValue._M_t._M_impl._0_24_ = auVar3;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)pCVar1;
  mapValue._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_01;
  orderForm.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = bVar8;
  orderForm.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar7;
  orderForm.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._9_15_ = in_stack_ffffffffffffffa1;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa8;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffff88;
  CWallet::CommitTransaction(this_00,tx_00,mapValue,orderForm);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&stack0xffffffffffffff68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&stack0xffffffffffffffa8);
  if (this_01 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void commitTransaction(CTransactionRef tx,
        WalletValueMap value_map,
        WalletOrderForm order_form) override
    {
        LOCK(m_wallet->cs_wallet);
        m_wallet->CommitTransaction(std::move(tx), std::move(value_map), std::move(order_form));
    }